

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstatemanager_args.cpp
# Opt level: O3

Result<void> *
node::ApplyArgsManOptions(Result<void> *__return_storage_ptr__,ArgsManager *args,Options *opts)

{
  optional<arith_uint256> *poVar1;
  undefined8 *puVar2;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string_view source_file;
  bool bVar6;
  optional<bool> oVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int64_t iVar11;
  Logger *pLVar12;
  _Storage<long,_true> _Var13;
  uint uVar14;
  uint *in_R8;
  long in_FS_OFFSET;
  optional<long> oVar15;
  string_view input;
  string_view input_00;
  string_view str;
  string_view logging_function;
  string log_msg;
  optional<uint256> min_work;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  bilingual_str local_1a8;
  long *local_168;
  long local_160;
  long local_158 [2];
  undefined1 local_148 [32];
  long *local_128 [2];
  long local_118 [2];
  bilingual_str local_108;
  _Storage<uint256,_true> local_c8;
  char local_a8;
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  bool local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _Var3._M_p = local_148 + 0x10;
  local_148._0_8_ = _Var3._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"-checkblockindex","");
  oVar15 = ArgsManager::GetIntArg(args,(string *)local_148);
  if ((pointer)local_148._0_8_ != _Var3._M_p) {
    operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
  }
  if (((undefined1  [16])
       oVar15.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_a0._0_8_ = &local_90;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"-checkblockindex","");
    ArgsManager::GetArg((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_148,args,(string *)local_a0);
    if ((opts->check_block_index).super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged == false) {
      (opts->check_block_index).super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_engaged = true;
    }
    iVar9 = oVar15.super__Optional_base<long,_true,_true>._M_payload.
            super__Optional_payload_base<long>._M_payload._0_4_;
    if (local_148._8_8_ == 0) {
      iVar9 = 1;
    }
    (opts->check_block_index).super__Optional_base<int,_true,_true>._M_payload.
    super__Optional_payload_base<int>._M_payload._M_value = iVar9;
    if (local_128[0]._0_1_ == (string)0x1) {
      local_128[0] = (long *)((ulong)local_128[0] & 0xffffffffffffff00);
      if ((pointer)local_148._0_8_ != _Var3._M_p) {
        operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._0_8_ != &local_90) {
      operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
    }
  }
  local_148._0_8_ = _Var3._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"-checkpoints","");
  oVar7 = ArgsManager::GetBoolArg(args,(string *)local_148);
  if ((pointer)local_148._0_8_ != _Var3._M_p) {
    operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
  }
  if (((ushort)oVar7.super__Optional_base<bool,_true,_true>._M_payload.
               super__Optional_payload_base<bool> >> 8 & 1) != 0) {
    opts->checkpoints_enabled =
         oVar7.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>.
         _M_payload;
  }
  local_148._0_8_ = _Var3._M_p;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"-minimumchainwork","");
  ArgsManager::GetArg((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_a0,args,(string *)local_148);
  if ((pointer)local_148._0_8_ != _Var3._M_p) {
    operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
  }
  bVar6 = true;
  if (local_80 == true) {
    input._M_str = (char *)local_a0._0_8_;
    input._M_len = local_a0._8_8_;
    detail::FromUserHex<uint256>((optional<uint256> *)&local_c8._M_value,input);
    if (local_a8 == '\x01') {
      UintToArith256((arith_uint256 *)local_148,&local_c8._M_value);
      poVar1 = &opts->minimum_chain_work;
      if ((opts->minimum_chain_work).super__Optional_base<arith_uint256,_false,_false>._M_payload.
          super__Optional_payload_base<arith_uint256>._M_engaged == false) {
        *(ulong *)((long)&(opts->minimum_chain_work).
                          super__Optional_base<arith_uint256,_false,_false>._M_payload.
                          super__Optional_payload_base<arith_uint256>._M_payload + 0x10) =
             CONCAT71(local_148._17_7_,local_148[0x10]);
        *(undefined8 *)
         ((long)&(opts->minimum_chain_work).super__Optional_base<arith_uint256,_false,_false>.
                 _M_payload.super__Optional_payload_base<arith_uint256>._M_payload + 0x18) =
             local_148._24_8_;
        *(undefined8 *)
         &(poVar1->super__Optional_base<arith_uint256,_false,_false>)._M_payload.
          super__Optional_payload_base<arith_uint256>._M_payload = local_148._0_8_;
        *(undefined8 *)
         ((long)&(opts->minimum_chain_work).super__Optional_base<arith_uint256,_false,_false>.
                 _M_payload.super__Optional_payload_base<arith_uint256>._M_payload + 8) =
             local_148._8_8_;
        (opts->minimum_chain_work).super__Optional_base<arith_uint256,_false,_false>._M_payload.
        super__Optional_payload_base<arith_uint256>._M_engaged = true;
      }
      else if (poVar1 != (optional<arith_uint256> *)local_148) {
        *(ulong *)((long)&(opts->minimum_chain_work).
                          super__Optional_base<arith_uint256,_false,_false>._M_payload.
                          super__Optional_payload_base<arith_uint256>._M_payload + 0x10) =
             CONCAT71(local_148._17_7_,local_148[0x10]);
        *(undefined8 *)
         ((long)&(opts->minimum_chain_work).super__Optional_base<arith_uint256,_false,_false>.
                 _M_payload.super__Optional_payload_base<arith_uint256>._M_payload + 0x18) =
             local_148._24_8_;
        *(undefined8 *)
         &(poVar1->super__Optional_base<arith_uint256,_false,_false>)._M_payload.
          super__Optional_payload_base<arith_uint256>._M_payload = local_148._0_8_;
        *(undefined8 *)
         ((long)&(opts->minimum_chain_work).super__Optional_base<arith_uint256,_false,_false>.
                 _M_payload.super__Optional_payload_base<arith_uint256>._M_payload + 8) =
             local_148._8_8_;
      }
    }
    else {
      local_168 = local_158;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_168,
                 "Invalid minimum work specified (%s), must be up to %d hex digits","");
      local_148._0_8_ = _Var3._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_148,local_168,local_160 + (long)local_168);
      local_128[0] = local_118;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_128,local_168,local_160 + (long)local_168);
      local_58._M_dataplus._M_p._0_4_ = 0x40;
      tinyformat::format<std::__cxx11::string,unsigned_int>
                (&local_108,(tinyformat *)local_148,(bilingual_str *)local_a0,&local_58,in_R8);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar2;
      paVar4 = &local_108.original.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.original._M_dataplus._M_p == paVar4) {
        *puVar2 = CONCAT71(local_108.original.field_2._M_allocated_capacity._1_7_,
                           local_108.original.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
             local_108.original.field_2._8_8_;
      }
      else {
        *(pointer *)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate> =
             local_108.original._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
             CONCAT71(local_108.original.field_2._M_allocated_capacity._1_7_,
                      local_108.original.field_2._M_local_buf[0]);
      }
      paVar5 = &local_108.translated.field_2;
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
           local_108.original._M_string_length;
      local_108.original._M_string_length = 0;
      local_108.original.field_2._M_local_buf[0] = '\0';
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->m_variant).
                       super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
      *(undefined8 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.translated._M_dataplus._M_p == paVar5) {
        *puVar2 = CONCAT71(local_108.translated.field_2._M_allocated_capacity._1_7_,
                           local_108.translated.field_2._M_local_buf[0]);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
             local_108.translated.field_2._8_8_;
      }
      else {
        *(pointer *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
             local_108.translated._M_dataplus._M_p;
        *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                          super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
             CONCAT71(local_108.translated.field_2._M_allocated_capacity._1_7_,
                      local_108.translated.field_2._M_local_buf[0]);
      }
      *(size_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
           local_108.translated._M_string_length;
      local_108.translated._M_string_length = 0;
      local_108.translated.field_2._M_local_buf[0] = '\0';
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
      local_108.original._M_dataplus._M_p = (pointer)paVar4;
      local_108.translated._M_dataplus._M_p = (pointer)paVar5;
      if (local_128[0] != local_118) {
        operator_delete(local_128[0],local_118[0] + 1);
      }
      if ((pointer)local_148._0_8_ != _Var3._M_p) {
        operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
      }
      if (local_168 != local_158) {
        operator_delete(local_168,local_158[0] + 1);
      }
      bVar6 = false;
    }
  }
  if (local_80 == true) {
    local_80 = false;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._0_8_ != &local_90) {
      operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
    }
  }
  if (bVar6) {
    local_148._0_8_ = _Var3._M_p;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"-assumevalid","");
    ArgsManager::GetArg((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_a0,args,(string *)local_148);
    if ((pointer)local_148._0_8_ != _Var3._M_p) {
      operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
    }
    bVar6 = true;
    if (local_80 == true) {
      input_00._M_str = (char *)local_a0._0_8_;
      input_00._M_len = local_a0._8_8_;
      detail::FromUserHex<uint256>((optional<uint256> *)&local_c8._M_value,input_00);
      if (local_a8 == '\x01') {
        *(undefined8 *)
         &(opts->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_payload = local_c8._0_8_;
        *(undefined8 *)
         ((long)&(opts->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
                 super__Optional_payload_base<uint256>._M_payload + 8) = local_c8._8_8_;
        *(undefined8 *)
         ((long)&(opts->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
                 super__Optional_payload_base<uint256>._M_payload + 0x10) = local_c8._16_8_;
        *(undefined8 *)
         ((long)&(opts->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
                 super__Optional_payload_base<uint256>._M_payload + 0x18) = local_c8._24_8_;
        if ((opts->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
            super__Optional_payload_base<uint256>._M_engaged == false) {
          (opts->assumed_valid_block).super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_engaged = true;
        }
      }
      else {
        local_1c8 = local_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1c8,
                   "Invalid assumevalid block hash specified (%s), must be up to %d hex digits (or 0 to disable)"
                   ,"");
        local_148._0_8_ = _Var3._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_148,local_1c8,local_1c0 + (long)local_1c8);
        local_128[0] = local_118;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_128,local_1c8,local_1c0 + (long)local_1c8);
        local_58._M_dataplus._M_p._0_4_ = 0x40;
        tinyformat::format<std::__cxx11::string,unsigned_int>
                  (&local_1a8,(tinyformat *)local_148,(bilingual_str *)local_a0,&local_58,in_R8);
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate> = puVar2;
        paVar4 = &local_1a8.original.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8.original._M_dataplus._M_p == paVar4) {
          *puVar2 = CONCAT71(local_1a8.original.field_2._M_allocated_capacity._1_7_,
                             local_1a8.original.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x18) =
               local_1a8.original.field_2._8_8_;
        }
        else {
          *(pointer *)
           &(__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate> =
               local_1a8.original._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x10) =
               CONCAT71(local_1a8.original.field_2._M_allocated_capacity._1_7_,
                        local_1a8.original.field_2._M_local_buf[0]);
        }
        paVar5 = &local_1a8.translated.field_2;
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 8) =
             local_1a8.original._M_string_length;
        local_1a8.original._M_string_length = 0;
        local_1a8.original.field_2._M_local_buf[0] = '\0';
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->m_variant).
                         super__Variant_base<bilingual_str,_std::monostate>.
                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                         super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30);
        *(undefined8 **)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) = puVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8.translated._M_dataplus._M_p == paVar5) {
          *puVar2 = CONCAT71(local_1a8.translated.field_2._M_allocated_capacity._1_7_,
                             local_1a8.translated.field_2._M_local_buf[0]);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x38) =
               local_1a8.translated.field_2._8_8_;
        }
        else {
          *(pointer *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x20) =
               local_1a8.translated._M_dataplus._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                            super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x30) =
               CONCAT71(local_1a8.translated.field_2._M_allocated_capacity._1_7_,
                        local_1a8.translated.field_2._M_local_buf[0]);
        }
        *(size_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x28) =
             local_1a8.translated._M_string_length;
        local_1a8.translated._M_string_length = 0;
        local_1a8.translated.field_2._M_local_buf[0] = '\0';
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\0';
        local_1a8.original._M_dataplus._M_p = (pointer)paVar4;
        local_1a8.translated._M_dataplus._M_p = (pointer)paVar5;
        if (local_128[0] != local_118) {
          operator_delete(local_128[0],local_118[0] + 1);
        }
        if ((pointer)local_148._0_8_ != _Var3._M_p) {
          operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
        }
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        bVar6 = false;
      }
    }
    if (local_80 == true) {
      local_80 = false;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._0_8_ != &local_90) {
        operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
      }
    }
    if (bVar6) {
      local_148._0_8_ = _Var3._M_p;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"-maxtipage","");
      oVar15 = ArgsManager::GetIntArg(args,(string *)local_148);
      if ((pointer)local_148._0_8_ != _Var3._M_p) {
        operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
      }
      if (((undefined1  [16])
           oVar15.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (opts->max_tip_age).__r =
             oVar15.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
      }
      ReadDatabaseArgs(args,&opts->block_tree_db);
      ReadDatabaseArgs(args,&opts->coins_db);
      ReadCoinsViewArgs(args,&opts->coins_view);
      local_148._0_8_ = _Var3._M_p;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"-par","");
      iVar11 = ArgsManager::GetIntArg(args,(string *)local_148,0);
      iVar9 = (int)iVar11;
      if ((pointer)local_148._0_8_ != _Var3._M_p) {
        operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
      }
      if (iVar9 < 1) {
        iVar8 = GetNumCores();
        iVar9 = iVar8 + iVar9;
      }
      uVar14 = 0xf;
      if (iVar9 - 1U < 0xf) {
        uVar14 = iVar9 - 1U;
      }
      uVar10 = 0;
      if (0 < iVar9) {
        uVar10 = uVar14;
      }
      opts->worker_threads_num = uVar10;
      pLVar12 = LogInstance();
      bVar6 = BCLog::Logger::Enabled(pLVar12);
      if (bVar6) {
        local_148._8_8_ = 0;
        local_148[0x10] = '\0';
        local_148._0_8_ = _Var3._M_p;
        tinyformat::format<int>
                  ((string *)local_a0,"Script verification uses %d additional threads\n",
                   &opts->worker_threads_num);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._0_8_ != &local_90) {
          operator_delete((void *)local_a0._0_8_,local_90._M_allocated_capacity + 1);
        }
        pLVar12 = LogInstance();
        local_a0._0_8_ = (pointer)0x68;
        local_a0._8_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstatemanager_args.cpp"
        ;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/chainstatemanager_args.cpp"
        ;
        source_file._M_len = 0x68;
        str._M_str = (char *)local_148._0_8_;
        str._M_len = local_148._8_8_;
        logging_function._M_str = "ApplyArgsManOptions";
        logging_function._M_len = 0x13;
        BCLog::Logger::LogPrintStr(pLVar12,str,logging_function,source_file,0x40,ALL,Info);
        if ((pointer)local_148._0_8_ != _Var3._M_p) {
          operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
        }
      }
      local_148._0_8_ = _Var3._M_p;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"-maxsigcachesize","");
      oVar15 = ArgsManager::GetIntArg(args,(string *)local_148);
      if ((pointer)local_148._0_8_ != _Var3._M_p) {
        operator_delete((void *)local_148._0_8_,CONCAT71(local_148._17_7_,local_148[0x10]) + 1);
      }
      if (((undefined1  [16])
           oVar15.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        _Var13._M_value = 0;
        if (0 < oVar15.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_payload) {
          _Var13._M_value =
               oVar15.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload;
        }
        opts->script_execution_cache_bytes = _Var13._M_value << 0x13;
        opts->signature_cache_bytes = _Var13._M_value << 0x13;
      }
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\x01';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<void> ApplyArgsManOptions(const ArgsManager& args, ChainstateManager::Options& opts)
{
    if (auto value{args.GetIntArg("-checkblockindex")}) {
        // Interpret bare -checkblockindex argument as 1 instead of 0.
        opts.check_block_index = args.GetArg("-checkblockindex")->empty() ? 1 : *value;
    }

    if (auto value{args.GetBoolArg("-checkpoints")}) opts.checkpoints_enabled = *value;

    if (auto value{args.GetArg("-minimumchainwork")}) {
        if (auto min_work{uint256::FromUserHex(*value)}) {
            opts.minimum_chain_work = UintToArith256(*min_work);
        } else {
            return util::Error{strprintf(Untranslated("Invalid minimum work specified (%s), must be up to %d hex digits"), *value, uint256::size() * 2)};
        }
    }

    if (auto value{args.GetArg("-assumevalid")}) {
        if (auto block_hash{uint256::FromUserHex(*value)}) {
            opts.assumed_valid_block = *block_hash;
        } else {
            return util::Error{strprintf(Untranslated("Invalid assumevalid block hash specified (%s), must be up to %d hex digits (or 0 to disable)"), *value, uint256::size() * 2)};
        }
    }

    if (auto value{args.GetIntArg("-maxtipage")}) opts.max_tip_age = std::chrono::seconds{*value};

    ReadDatabaseArgs(args, opts.block_tree_db);
    ReadDatabaseArgs(args, opts.coins_db);
    ReadCoinsViewArgs(args, opts.coins_view);

    int script_threads = args.GetIntArg("-par", DEFAULT_SCRIPTCHECK_THREADS);
    if (script_threads <= 0) {
        // -par=0 means autodetect (number of cores - 1 script threads)
        // -par=-n means "leave n cores free" (number of cores - n - 1 script threads)
        script_threads += GetNumCores();
    }
    // Subtract 1 because the main thread counts towards the par threads.
    opts.worker_threads_num = std::clamp(script_threads - 1, 0, MAX_SCRIPTCHECK_THREADS);
    LogPrintf("Script verification uses %d additional threads\n", opts.worker_threads_num);

    if (auto max_size = args.GetIntArg("-maxsigcachesize")) {
        // 1. When supplied with a max_size of 0, both the signature cache and
        //    script execution cache create the minimum possible cache (2
        //    elements). Therefore, we can use 0 as a floor here.
        // 2. Multiply first, divide after to avoid integer truncation.
        size_t clamped_size_each = std::max<int64_t>(*max_size, 0) * (1 << 20) / 2;
        opts.script_execution_cache_bytes = clamped_size_each;
        opts.signature_cache_bytes = clamped_size_each;
    }

    return {};
}